

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O0

void __thiscall CJSONException::CJSONException(CJSONException *this,string *Msg,JSONErrorType Type)

{
  JSONErrorType Type_local;
  string *Msg_local;
  CJSONException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__CJSONException_00196d10;
  std::__cxx11::string::string((string *)&this->m_Msg,(string *)Msg);
  this->m_ErrType = Type;
  return;
}

Assistant:

CJSONException(const std::string &Msg, JSONErrorType Type) : m_Msg(Msg), m_ErrType(Type) {}